

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void load_pixel_w4(uint8_t *above,uint8_t *left,int height,__m128i *pixels)

{
  byte bVar1;
  undefined4 uVar2;
  longlong lVar3;
  ushort local_148;
  byte local_d8;
  byte bStack_d7;
  byte bStack_d6;
  byte bStack_d5;
  ulong local_b8;
  __m128i zero;
  __m128i bp;
  __m128i d;
  __m128i *pixels_local;
  int height_local;
  uint8_t *left_local;
  uint8_t *above_local;
  ushort uStack_26;
  ushort uStack_24;
  ushort uStack_22;
  ushort uStack_16;
  ushort uStack_14;
  ushort uStack_12;
  
  uVar2 = *(undefined4 *)above;
  if (height == 4) {
    local_b8 = (ulong)*(uint *)left;
    pixels[1][0] = local_b8;
    pixels[1][1] = 0;
  }
  else if (height == 8) {
    pixels[1][0] = *(longlong *)left;
    pixels[1][1] = 0;
  }
  else {
    lVar3 = *(longlong *)(left + 8);
    pixels[1][0] = *(longlong *)left;
    pixels[1][1] = lVar3;
  }
  bVar1 = above[3];
  pixels[2][0] = (ulong)CONCAT16(bVar1,(uint6)CONCAT14(bVar1,(uint)CONCAT12(bVar1,(ushort)bVar1)));
  pixels[2][1] = (ulong)CONCAT16(bVar1,(uint6)CONCAT14(bVar1,(uint)CONCAT12(bVar1,(ushort)bVar1)));
  bVar1 = left[height + -1];
  local_d8 = (byte)uVar2;
  bStack_d7 = (byte)((uint)uVar2 >> 8);
  bStack_d6 = (byte)((uint)uVar2 >> 0x10);
  bStack_d5 = (byte)((uint)uVar2 >> 0x18);
  local_148 = (ushort)local_d8;
  uStack_16 = (ushort)bStack_d7;
  uStack_14 = (ushort)bStack_d6;
  uStack_12 = (ushort)bStack_d5;
  uStack_26 = (ushort)bVar1;
  uStack_24 = (ushort)bVar1;
  uStack_22 = (ushort)bVar1;
  *(ushort *)*pixels = local_148;
  *(ushort *)((long)*pixels + 2) = (ushort)bVar1;
  *(ushort *)((long)*pixels + 4) = uStack_16;
  *(ushort *)((long)*pixels + 6) = uStack_26;
  *(ushort *)(*pixels + 1) = uStack_14;
  *(ushort *)((long)*pixels + 10) = uStack_24;
  *(ushort *)((long)*pixels + 0xc) = uStack_12;
  *(ushort *)((long)*pixels + 0xe) = uStack_22;
  return;
}

Assistant:

static inline void load_pixel_w4(const uint8_t *above, const uint8_t *left,
                                 int height, __m128i *pixels) {
  __m128i d = _mm_cvtsi32_si128(((const int *)above)[0]);
  if (height == 4)
    pixels[1] = _mm_cvtsi32_si128(((const int *)left)[0]);
  else if (height == 8)
    pixels[1] = _mm_loadl_epi64(((const __m128i *)left));
  else
    pixels[1] = _mm_loadu_si128(((const __m128i *)left));

  pixels[2] = _mm_set1_epi16((int16_t)above[3]);

  const __m128i bp = _mm_set1_epi16((int16_t)left[height - 1]);
  const __m128i zero = _mm_setzero_si128();
  d = _mm_unpacklo_epi8(d, zero);
  pixels[0] = _mm_unpacklo_epi16(d, bp);
}